

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O2

bool CompareNodeTXTime(NodeEvictionCandidate *a,NodeEvictionCandidate *b)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  
  lVar1 = (b->m_last_tx_time).__r;
  lVar2 = (a->m_last_tx_time).__r;
  if (lVar2 == lVar1) {
    cVar3 = b->m_relay_txs;
    if ((a->m_relay_txs == (bool)cVar3) && (cVar3 = a->fBloomFilter, (bool)cVar3 == b->fBloomFilter)
       ) {
      cVar3 = (b->m_connected).__r < (a->m_connected).__r;
    }
  }
  else {
    cVar3 = lVar2 < lVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool CompareNodeTXTime(const NodeEvictionCandidate &a, const NodeEvictionCandidate &b)
{
    // There is a fall-through here because it is common for a node to have more than a few peers that have not yet relayed txn.
    if (a.m_last_tx_time != b.m_last_tx_time) return a.m_last_tx_time < b.m_last_tx_time;
    if (a.m_relay_txs != b.m_relay_txs) return b.m_relay_txs;
    if (a.fBloomFilter != b.fBloomFilter) return a.fBloomFilter;
    return a.m_connected > b.m_connected;
}